

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

void dgn_growths(level *lev,boolean showmsg,boolean update)

{
  undefined1 *puVar1;
  byte *pbVar2;
  int iVar3;
  monst *pmVar4;
  xchar xVar5;
  xchar xVar6;
  level *lev_00;
  char cVar7;
  boolean bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  trap *ptVar14;
  obj *poVar15;
  char *pcVar16;
  byte bVar17;
  char *pcVar18;
  undefined7 in_register_00000011;
  ulong uVar19;
  rm (*parVar20) [21];
  char *pcVar21;
  schar *psVar22;
  undefined7 in_register_00000031;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  coord pos;
  coord pos2;
  obj *in_stack_ffffffffffffff88;
  coord local_6d;
  xchar local_6b;
  coord local_6a;
  level *local_68;
  rm (*local_60) [21];
  undefined4 local_54;
  undefined4 local_50;
  xchar local_49;
  ulong local_48;
  long local_40;
  rm (*local_38) [21];
  
  local_50 = (undefined4)CONCAT71(in_register_00000011,update);
  local_54 = (undefined4)CONCAT71(in_register_00000031,showmsg);
  uVar10 = mt_random();
  local_6b = -1;
  local_49 = -1;
  rndmappos(&local_6b,&local_49);
  xVar6 = local_49;
  xVar5 = local_6b;
  local_60 = lev->locations;
  cVar7 = lev->locations[local_6b][local_49].typ;
  local_68 = lev;
  if (((cVar7 == '\r') || ((cVar7 == '\0' && ((*(uint *)&(lev->flags).field_0x8 & 0x100000) != 0))))
     && ((local_60[local_6b][local_49].field_0x6 & 0x80) == 0)) {
    uVar11 = mt_random();
    dtoxy(&local_6d,uVar11 & 7);
    local_6d.x = local_6d.x + xVar5;
    local_6d.y = local_6d.y + xVar6;
    uVar12 = mt_random();
    if (uVar12 * -0x55555555 < 0x55555556) {
      uVar12 = mt_random();
      dtoxy(&local_6a,uVar11 + (uVar12 & 1) & 7);
      local_6d.x = local_6d.x + local_6a.x;
      local_6d.y = local_6d.y + local_6a.y;
    }
    parVar20 = local_60;
    if (((byte)(local_6d.x - 1U) < 0x4f) && ((byte)local_6d.y < 0x15)) {
      uVar19 = (ulong)(byte)local_6d.x;
      uVar23 = (ulong)(byte)local_6d.y;
      if (((((local_60[uVar19][uVar23].field_0x7 & 4) != 0) &&
           (((((viz_array[uVar23][uVar19] & 2U) == 0 &&
              (cVar7 = inside_shop(local_68,local_6d.x,local_6d.y), cVar7 == '\0')) &&
             ((parVar20[uVar19][uVar23].typ & 0xfeU) == 0x18)) &&
            ((u.ux != local_6d.x || (u.uy != local_6d.y)))))) &&
          ((pmVar4 = local_68->monsters[local_6d.x][local_6d.y], pmVar4 == (monst *)0x0 ||
           ((pmVar4->field_0x61 & 2) != 0)))) &&
         ((ptVar14 = t_at(local_68,(int)local_6d.x,(int)local_6d.y), ptVar14 == (trap *)0x0 &&
          (level->objects[local_6d.x][local_6d.y] == (obj *)0x0)))) {
        iVar13 = 0;
        uVar11 = (int)local_6d.x - 1;
        do {
          iVar24 = -1;
          do {
            if (((0x4e < uVar11 - 1) || (0x14 < (uint)(local_6d.y + iVar24))) ||
               (local_60[uVar11][(uint)(local_6d.y + iVar24)].typ < '\x18')) {
              iVar13 = iVar13 + 1;
            }
            iVar24 = iVar24 + 1;
          } while (iVar24 != 2);
          bVar27 = uVar11 != (int)local_6d.x + 1U;
          uVar11 = uVar11 + 1;
        } while (bVar27);
        if (iVar13 < 3) {
          parVar20[uVar19][uVar23].typ = '\r';
          puVar1 = &parVar20[uVar19][uVar23].field_0x6;
          *puVar1 = *puVar1 & 0xef;
          block_point((int)local_6d.x,(int)local_6d.y);
        }
      }
    }
  }
  iVar13 = herb_info[uVar10 & 3].herb;
  if (herb_info[uVar10 & 3].in_water == '\0') {
    local_6a.x = -1;
    local_6b = -1;
    rndmappos(&local_6a.x,&local_6b);
    xVar6 = local_6a.x;
    xVar5 = local_6b;
    poVar15 = sobj_at(iVar13,local_68,(int)local_6a.x,(int)local_6b);
    if ((poVar15 != (obj *)0x0) &&
       (bVar8 = herb_can_grow_at(local_68,xVar6,xVar5,'\0'), bVar8 != '\0')) {
      iVar24 = poVar15->quan;
      uVar10 = mt_random();
      if ((int)(uVar10 % 3) < iVar24) {
        iVar24 = 0;
        uVar10 = mt_random();
        uVar19 = (ulong)uVar10;
        local_48 = uVar19;
        do {
          dtoxy(&local_6d,(int)uVar19 + iVar24 & 7);
          local_6d.x = local_6d.x + xVar6;
          local_6d.y = local_6d.y + xVar5;
          if (((byte)local_6d.y < 0x15 && (byte)(local_6d.x - 1U) < 0x4f) &&
             (bVar8 = herb_can_grow_at(local_68,local_6d.x,local_6d.y,'\0'), bVar8 != '\0')) {
            poVar15 = sobj_at(iVar13,local_68,(int)local_6d.x,(int)local_6d.y);
            lev_00 = local_68;
            if (poVar15 == (obj *)0x0) {
              poVar15 = mksobj(local_68,iVar13,'\x01','\0');
              poVar15->quan = 1;
              uVar10 = weight(poVar15);
              poVar15->owt = uVar10;
              place_object(poVar15,lev_00,(int)local_6d.x,(int)local_6d.y);
              if ((char)local_50 != '\0') {
                newsym((int)local_6d.x,(int)local_6d.y);
              }
              if ((((viz_array[local_6d.y][local_6d.x] & 2U) != 0) && ((char)local_54 != '\0')) &&
                 (flags.verbose != '\0')) {
                if (iVar13 == 0x11d) {
                  pcVar16 = "some garlic";
                }
                else {
                  pcVar16 = xname(poVar15);
                  pcVar16 = an(pcVar16);
                }
                pcVar21 = surface((int)local_6d.x,(int)local_6d.y);
                Norep("Suddenly you notice %s growing on the %s.",pcVar16,pcVar21);
              }
              break;
            }
            iVar3 = poVar15->quan;
            uVar10 = mt_random();
            uVar19 = local_48;
            if (iVar3 <= (int)(uVar10 % 3)) goto LAB_001a283a;
          }
          iVar24 = iVar24 + 1;
        } while (iVar24 != 8);
      }
      else {
        poVar15->quan = poVar15->quan + 1;
        uVar10 = weight(poVar15);
        poVar15->owt = uVar10;
      }
    }
  }
  else {
    local_6d.x = 0xff;
    local_6a.x = -1;
    rndmappos(&local_6d.x,&local_6a.x);
    xVar6 = local_6a.x;
    xVar5 = local_6d.x;
    poVar15 = sobj_at(iVar13,local_68,(int)local_6d.x,(int)local_6a.x);
    if ((poVar15 != (obj *)0x0) &&
       (bVar8 = herb_can_grow_at(local_68,xVar5,xVar6,'\x01'), bVar8 != '\0')) {
LAB_001a283a:
      poVar15->quan = poVar15->quan + 1;
      uVar10 = weight(poVar15);
      poVar15->owt = uVar10;
    }
  }
  uVar10 = mt_random();
  if ((uVar10 * -0x11111111 >> 1 | (uint)((uVar10 * -0x11111111 & 1) != 0) << 0x1f) < 0x8888889) {
    local_6a.x = -1;
    local_6b = -1;
    rndmappos(&local_6a.x,&local_6b);
    xVar5 = local_6b;
    local_48 = (ulong)local_6a.x;
    lVar25 = (long)local_6b;
    parVar20 = local_60 + local_48;
    cVar7 = (*parVar20)[lVar25].typ;
    if (((cVar7 == '\r') ||
        ((cVar7 == '\0' && ((*(uint *)&(local_68->flags).field_0x8 & 0x100000) != 0)))) &&
       (((*parVar20)[lVar25].field_0x6 & 0x90) == 0)) {
      iVar13 = 0;
      local_40 = lVar25 * 3;
      local_38 = parVar20;
      uVar10 = mt_random();
      do {
        dtoxy(&local_6d,uVar10 + iVar13 & 7);
        parVar20 = local_60;
        bVar9 = local_6d.x + (char)local_48;
        bVar17 = local_6d.y + xVar5;
        local_6d.x = bVar9;
        local_6d.y = bVar17;
        if ((0x4e < (byte)(bVar9 - 1)) || (0x14 < bVar17)) break;
        cVar7 = local_60[bVar9][bVar17].typ;
        if (('\x17' < cVar7 || (byte)(cVar7 - 0x11U) < 4) &&
           (poVar15 = rnd_treefruit_at((uint)bVar9,(uint)bVar17), poVar15 != (obj *)0x0)) {
          poVar15->quan = 1;
          uVar10 = weight(poVar15);
          poVar15->owt = uVar10;
          obj_extract_self(poVar15);
          if ((char)local_54 != '\0') {
            psVar22 = &parVar20[bVar9][bVar17].typ;
            if ((viz_array[local_6d.y][local_6d.x] & 2U) == 0) {
              if ((viz_array[lVar25][local_48] & 2U) == 0) {
                iVar13 = dist2((int)local_6d.x,(int)local_6d.y,(int)u.ux,(int)u.uy);
                if ((iVar13 < 9) && (poVar15->otyp != 0x115)) {
                  cVar7 = *psVar22;
                  pcVar16 = "splut";
                  if ((byte)(cVar7 - 0x11U) < 4) {
                    pcVar16 = "plop";
                  }
                  if (cVar7 == '\x1c') {
                    pcVar16 = "plop";
                  }
                  You_hear("a %s!",pcVar16);
                }
                goto LAB_001a2e6b;
              }
              pcVar16 = "Something";
LAB_001a2e33:
              bVar9 = *psVar22;
              pcVar18 = "the tree";
              if ((char)bVar9 < '\x11') {
                pcVar21 = "";
              }
              else {
                pcVar21 = "";
                if (bVar9 < 0x15) {
                  pcVar21 = " into the water";
                }
              }
            }
            else {
              pcVar16 = xname(poVar15);
              pcVar16 = An(pcVar16);
              if ((viz_array[lVar25][local_48] & 2U) != 0) goto LAB_001a2e33;
              pcVar21 = "";
              pcVar18 = "somewhere";
            }
            Norep("%s falls from %s%s.",pcVar16,pcVar18,pcVar21);
          }
LAB_001a2e6b:
          place_object(poVar15,local_68,(int)local_6d.x,(int)local_6d.y);
          stackobj(in_stack_ffffffffffffff88);
          uVar10 = mt_random();
          if (0x2aaaaaaa <
              (uVar10 * -0x55555555 >> 1 | (uint)((uVar10 * -0x55555555 & 1) != 0) << 0x1f)) {
            pbVar2 = &(*local_38)[0].field_0x6 + local_40 * 4;
            *pbVar2 = *pbVar2 | 0x10;
          }
          if ((char)local_50 != '\0') {
            newsym((int)local_6d.x,(int)local_6d.y);
          }
          break;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 8);
    }
  }
  uVar11 = mt_random();
  bVar8 = on_level(&local_68->z,&dungeon_topology.d_water_level);
  uVar10 = 200;
  if (bVar8 == '\0') {
    uVar10 = 0x19;
  }
  local_6a.x = -1;
  local_6b = -1;
  rndmappos(&local_6a.x,&local_6b);
  dtoxy(&local_6d,uVar11 & 7);
  xVar6 = local_6a.x;
  xVar5 = local_6b;
  lVar26 = (long)local_6a.x;
  local_6d.x = local_6d.x + local_6a.x;
  lVar25 = (long)local_6b;
  local_6d.y = local_6d.y + local_6b;
  if (((((byte)local_6d.y < 0x15 && (byte)(local_6d.x - 1U) < 0x4f) &&
       ((byte)(local_60[lVar26][lVar25].typ - 0x11U) < 4)) &&
      ((byte)(local_60[(byte)local_6d.x][(byte)local_6d.y].typ - 0x11U) < 4)) &&
     ((poVar15 = local_68->objects[lVar26][lVar25], poVar15 != (obj *)0x0 &&
      (poVar15->where == '\x01')))) {
    if (1 < poVar15->quan) {
      poVar15 = splitobj(poVar15,(ulong)(poVar15->quan - 1));
    }
    if (uVar10 < poVar15->owt) {
      stackobj(in_stack_ffffffffffffff88);
    }
    else {
      if ((((char)local_54 != '\0') && ((u._1052_1_ & 2) != 0)) &&
         (((viz_array[local_6d.y][local_6d.x] & 2U) != 0 || ((viz_array[lVar25][lVar26] & 2U) != 0))
         )) {
        pcVar16 = xname(poVar15);
        pcVar16 = An(pcVar16);
        if ((viz_array[lVar25][lVar26] & 2U) == 0) {
          pcVar21 = " towards you";
        }
        else {
          pcVar21 = "";
          if ((viz_array[local_6d.y][local_6d.x] & 2U) == 0) {
            pcVar21 = " away from you";
          }
        }
        pcVar18 = " the currents of";
        if (flags.verbose == '\0') {
          pcVar18 = "";
        }
        Norep("%s floats%s in%s the murky water.",pcVar16,pcVar21,pcVar18);
      }
      obj_extract_self(poVar15);
      place_object(poVar15,local_68,(int)local_6d.x,(int)local_6d.y);
      stackobj(in_stack_ffffffffffffff88);
      if ((char)local_50 != '\0') {
        newsym((int)xVar6,(int)xVar5);
        newsym((int)local_6d.x,(int)local_6d.y);
      }
    }
  }
  return;
}

Assistant:

void dgn_growths(struct level *lev, boolean showmsg, boolean update)
{
	int herbnum = rn2(SIZE(herb_info));
	seed_tree(lev, -1, -1);
	if (herb_info[herbnum].in_water)
	    grow_water_herbs(herb_info[herbnum].herb, lev, -1, -1);
	else
	    grow_herbs(herb_info[herbnum].herb, lev, -1, -1, showmsg, update);
	if (!rn2(30))
	    drop_ripe_treefruit(lev, -1, -1, showmsg, update);
	water_current(lev, -1, -1, rn2(8),
		      Is_waterlevel(&lev->z) ? 200 : 25, showmsg, update);
}